

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

LPSTR MapFileOpenModes(LPSTR str,BOOL *bTextMode)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  char *pcVar4;
  size_t sVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  
  if (bTextMode == (BOOL *)0x0) {
    fprintf(_stderr,"] %s %s:%d","MapFileOpenModes",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
            ,0x59);
    pcVar4 = "MapFileOpenModes called with a NULL parameter for bTextMode.\n";
  }
  else {
    *bTextMode = 1;
    if (str == (LPSTR)0x0) {
      fprintf(_stderr,"] %s %s:%d","MapFileOpenModes",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
              ,0x61);
      pcVar4 = "MapFileOpenModes called with a NULL parameter for str.\n";
    }
    else {
      pcVar4 = strchr(str,0x44);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = strchr(str,0x62);
        if (pcVar4 != (char *)0x0) {
          *bTextMode = 0;
        }
        sVar5 = strlen(str);
        pbVar6 = (byte *)PAL_malloc(sVar5 + 1);
        pbVar3 = pbVar6;
        if (pbVar6 == (byte *)0x0) {
          if (PAL_InitializeChakraCoreCalled != false) {
            return (LPSTR)0x0;
          }
          abort();
        }
        do {
          while( true ) {
            pbVar8 = pbVar3;
            pbVar2 = (byte *)str;
            pbVar7 = pbVar2 + 1;
            bVar1 = *pbVar2;
            if ((0x16 < bVar1 - 0x61) || ((0x420001U >> (bVar1 - 0x61 & 0x1f) & 1) == 0)) break;
            *pbVar8 = bVar1;
            str = (LPSTR)(byte *)0x0;
            pbVar3 = pbVar8 + 1;
            if ((pbVar7 != (byte *)0x0) && (str = (LPSTR)pbVar7, *pbVar7 == 0x2b)) {
              pbVar8[1] = 0x2b;
              str = (LPSTR)(pbVar2 + 2);
              pbVar3 = pbVar8 + 2;
            }
          }
          str = (LPSTR)pbVar7;
          pbVar3 = pbVar8;
        } while (bVar1 != 0);
        *pbVar8 = 0;
        return (LPSTR)pbVar6;
      }
      fprintf(_stderr,"] %s %s:%d","MapFileOpenModes",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
              ,0x7d);
      pcVar4 = "The PAL doesn\'t support the \'D\' flag for _fdopen and fopen.\n";
    }
  }
  fprintf(_stderr,pcVar4);
  return (LPSTR)0x0;
}

Assistant:

static LPSTR MapFileOpenModes(LPSTR str , BOOL * bTextMode)
{
    LPSTR retval = NULL;
    LPSTR temp = NULL;

    if (NULL == bTextMode)
    {
        ASSERT("MapFileOpenModes called with a NULL parameter for bTextMode.\n");
        return NULL;
    }

    *bTextMode = TRUE;

    if (NULL == str)
    {
        ASSERT("MapFileOpenModes called with a NULL parameter for str.\n");
        return NULL;
    }

    /* The PAL behaves differently for some Windows file open modes:

    c, n, S, R, and T: these are all hints to the system that aren't supported
    by the PAL. Since the user cannot depend on this behavior, it's safe to
    simply ignore these modes.

    D: specifies a file as temporary. This file is expected to be deleted when
    the last file descriptor is closed. The PAL does not support this behavior
    and asserts when this mode is used.

    t: represents opening in text mode. Calls to fdopen on Unix don't accept
    't' so it is silently stripped out. However, the PAL supports the mode by
    having the PAL wrappers do the translation of CR-LF to LF and vice versa.

    t vs. b: To get binary mode, you must explicitly use 'b'. If neither mode
    is specified on Windows, the default mode is defined by the global
    variable _fmode. The PAL simply defaults to text mode. After examining
    CLR usage patterns, the PAL behavior seems acceptable. */

    /* Check if the mode specifies deleting the temporary file
    automatically when the last file descriptor is closed.
    The PAL does not support this behavior. */
    if (NULL != strchr(str,'D'))
    {
        ASSERT("The PAL doesn't support the 'D' flag for _fdopen and fopen.\n");
        return NULL;
    }

    /* Check if the mode specifies opening in binary.
    If so, set the bTextMode to false. */
    if(NULL != strchr(str,'b'))
    {
        *bTextMode = FALSE;
    }

    retval = (LPSTR)PAL_malloc( ( strlen( str ) + 1 ) * sizeof( CHAR ) );
    if (NULL == retval)
    {
        ERROR("Unable to allocate memory.\n");
        return NULL;
    }

    temp = retval;
    while ( *str )
    {
        if ( *str == 'r' || *str == 'w' || *str == 'a' )
        {
            *temp = *str;
            temp++;
            if ( ( ++str != NULL ) && *str == '+' )
            {
                *temp = *str;
                temp++;
                str++;
            }
        }
        else
        {
            str++;
        }
    }
    *temp = '\0';
    return retval;
}